

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::microfacet::ndf(microfacet *this,vec3 *wm,args *args)

{
  float fVar1;
  float extraout_XMM0_Da;
  float fVar2;
  vec3 vVar3;
  undefined8 local_60;
  float_t local_58;
  undefined8 local_50;
  float_t local_48;
  float_t local_44;
  float_t fStack_40;
  float_t nrmsqr;
  float_t local_38;
  undefined1 local_30 [8];
  vec3 wm_std;
  args *args_local;
  vec3 *wm_local;
  microfacet *this_local;
  
  unique0x100000c2 = args;
  vVar3 = djb::operator*(&args->mtra,wm);
  local_38 = vVar3.z;
  wm_std.x = local_38;
  _fStack_40 = vVar3._0_8_;
  local_30._0_4_ = fStack_40;
  local_30._4_4_ = nrmsqr;
  _fStack_40 = vVar3;
  local_44 = dot((vec3 *)local_30,(vec3 *)local_30);
  fVar1 = inversesqrt<float>(&local_44);
  vVar3 = djb::operator*((vec3 *)local_30,fVar1);
  local_60 = vVar3._0_8_;
  local_50 = local_60;
  local_58 = vVar3.z;
  local_48 = local_58;
  (*(this->super_brdf)._vptr_brdf[0xb])(this,&local_50);
  fVar1 = stack0xffffffffffffffe0->detm;
  fVar2 = sqr<float>(&local_44);
  return extraout_XMM0_Da * (fVar1 / fVar2);
}

Assistant:

float_t microfacet::ndf(const vec3 &wm, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	float_t nrmsqr = dot(wm_std, wm_std);
	return ndf_std(wm_std * inversesqrt(nrmsqr)) * (args.detm / sqr(nrmsqr));
}